

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
flatbuffers::anon_unknown_0::FieldIdToIndex
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Object *object)

{
  uint16_t uVar1;
  uint uVar2;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar3;
  return_type this;
  reference pvVar4;
  return_type field;
  uint32_t i;
  Object *object_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *field_index_by_id;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  pVVar3 = reflection::Object::fields(object);
  uVar2 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::size(pVVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,(ulong)uVar2);
  field._0_4_ = 0;
  while( true ) {
    pVVar3 = reflection::Object::fields(object);
    uVar2 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::size(pVVar3);
    if (uVar2 <= (uint)field) break;
    pVVar3 = reflection::Object::fields(object);
    this = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(pVVar3,(uint)field);
    uVar1 = reflection::Field::id(this);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)uVar1);
    *pvVar4 = (uint)field;
    field._0_4_ = (uint)field + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<uint32_t> FieldIdToIndex(const reflection::Object *object) {
  std::vector<uint32_t> field_index_by_id;
  field_index_by_id.resize(object->fields()->size());

  // Create the mapping of field ID to the index into the vector.
  for (uint32_t i = 0; i < object->fields()->size(); ++i) {
    auto field = object->fields()->Get(i);
    field_index_by_id[field->id()] = i;
  }

  return field_index_by_id;
}